

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O0

void __thiscall Assimp::ASE::Dummy::Dummy(Dummy *this)

{
  allocator local_31;
  string local_30;
  Dummy *local_10;
  Dummy *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"DUMMY",&local_31);
  BaseNode::BaseNode(&this->super_BaseNode,Dummy,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

Dummy() AI_NO_EXCEPT
    : BaseNode  (BaseNode::Dummy, "DUMMY") {
        // empty
    }